

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

void __thiscall Chip8::CPU::run_cycle(CPU *this)

{
  ushort uVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  byte bVar5;
  bool bVar6;
  uint16_t uVar7;
  uint uVar8;
  ostream *poVar9;
  ushort uVar10;
  int i;
  int iVar11;
  int j;
  int iVar12;
  int x;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  SDL_Event event;
  
  bVar2 = Memory::getByte(this->_m,(uint)this->_program_counter);
  bVar3 = Memory::getByte(this->_m,this->_program_counter + 1);
  uVar1 = CONCAT11(bVar2,bVar3);
  poVar9 = std::operator<<((ostream *)&std::cout,"Operation at 0x");
  *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
       *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->_program_counter);
  poVar9 = std::operator<<(poVar9," -> ");
  *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 4;
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)uVar1);
  std::endl<char,std::char_traits<char>>(poVar9);
  if (0xf < bVar2 >> 4) goto switchD_0010297c_caseD_9;
  uVar10 = uVar1 & 0xfff;
  uVar14 = bVar2 & 0xf;
  bVar5 = bVar3 >> 4;
  uVar8 = (uint)bVar3;
  switch(bVar2 >> 4) {
  case 0:
    if (uVar1 == 0xee) {
      this->_program_counter = this->_stack_pointer;
    }
    else if (CONCAT11(bVar2,bVar3) == 0xe0) {
      Graphics::clear(this->_g);
    }
    else {
      Memory::dump(this->_m);
    }
    goto switchD_0010297c_caseD_9;
  case 1:
    goto switchD_0010297c_caseD_1;
  case 2:
    this->_stack_pointer = this->_program_counter + 2;
    goto switchD_0010297c_caseD_1;
  case 3:
    uVar7 = this->_program_counter;
    if (this->_registers[uVar14] == bVar3) goto LAB_00102b9a;
LAB_00102a23:
    uVar7 = uVar7 + 2;
    goto LAB_00102b9d;
  case 4:
    uVar7 = this->_program_counter;
    if (this->_registers[uVar14] == bVar3) goto LAB_00102a23;
LAB_00102b9a:
    uVar7 = uVar7 + 4;
LAB_00102b9d:
    this->_program_counter = uVar7;
    goto switchD_0010297c_caseD_9;
  case 5:
    if (this->_registers[uVar14] == this->_registers[bVar5]) {
      uVar10 = this->_program_counter + 4;
    }
    else {
      uVar10 = this->_program_counter + 2;
    }
switchD_0010297c_caseD_1:
    this->_program_counter = uVar10;
    goto switchD_0010297c_caseD_9;
  case 6:
    this->_registers[uVar14] = bVar3;
    break;
  case 7:
    this->_registers[uVar14] = this->_registers[uVar14] + bVar3;
    break;
  case 8:
    switch(uVar8 & 0xf) {
    case 0:
      bVar2 = this->_registers[bVar5];
      goto LAB_00102d37;
    case 1:
      this->_registers[uVar14] = this->_registers[uVar14] | this->_registers[bVar5];
      break;
    case 2:
      this->_registers[uVar14] = this->_registers[uVar14] & this->_registers[bVar5];
      break;
    case 3:
      this->_registers[uVar14] = this->_registers[uVar14] ^ this->_registers[bVar5];
      break;
    case 4:
      uVar8 = (uint)this->_registers[bVar5] + (uint)this->_registers[uVar14];
      this->_registers[0xf] = 0xff < uVar8;
      this->_registers[uVar14] = (uint8_t)(uVar8 % 0xff);
      break;
    case 5:
      this->_registers[0xf] = this->_registers[bVar5] <= this->_registers[uVar14];
      this->_registers[uVar14] = this->_registers[uVar14] - this->_registers[bVar5];
      break;
    case 6:
      this->_registers[0xf] = this->_registers[bVar5] & 1;
      bVar2 = this->_registers[bVar5] >> 1;
      goto LAB_00102d37;
    case 7:
      this->_registers[0xf] = this->_registers[uVar14] <= this->_registers[bVar5];
      bVar2 = this->_registers[bVar5] - this->_registers[uVar14];
      goto LAB_00102d37;
    case 0xe:
      this->_registers[0xf] = '\0';
      bVar2 = this->_registers[bVar5] * '\x02';
LAB_00102d37:
      this->_registers[uVar14] = bVar2;
    }
    break;
  default:
    goto switchD_0010297c_caseD_9;
  case 10:
switchD_0010297c_caseD_a:
    this->_index_register = uVar10;
    break;
  case 0xc:
    iVar11 = rand();
    this->_registers[uVar14] = bVar3 & (byte)iVar11;
    break;
  case 0xd:
    bVar2 = this->_registers[uVar14];
    bVar3 = this->_registers[bVar5];
    uVar1 = this->_index_register;
    uVar4 = '\0';
    for (uVar14 = 0; uVar14 != (uVar8 & 0xf); uVar14 = uVar14 + 1) {
      bVar5 = Memory::getByte(this->_m,uVar14 + uVar1);
      iVar11 = uVar14 + bVar3;
      uVar15 = 0x80;
      for (iVar12 = 0; iVar12 != 8; iVar12 = iVar12 + 1) {
        if ((bVar5 & uVar15) != 0) {
          x = (uint)bVar2 + iVar12;
          bVar6 = Graphics::get(this->_g,x,iVar11);
          if (bVar6) {
            uVar4 = '\x01';
          }
          Graphics::set(this->_g,x,iVar11,!bVar6);
        }
        uVar15 = uVar15 >> 1;
      }
    }
    this->_registers[0xf] = uVar4;
    break;
  case 0xe:
    if (bVar3 == 0xa1) {
      bVar2 = this->_registers[uVar14];
      while (iVar11 = SDL_PollEvent(&event), iVar11 != 0) {
        if ((event.type == 0x300) &&
           (event.window.data2 == *(int *)(kKeyCodeMap + (ulong)bVar2 * 4))) {
          poVar9 = std::operator<<((ostream *)&std::cout,"skipping");
          std::endl<char,std::char_traits<char>>(poVar9);
          this->_program_counter = this->_program_counter + 2;
        }
      }
    }
    break;
  case 0xf:
    if (bVar3 == 7) {
      bVar2 = this->_delay_timer;
      goto LAB_00102d37;
    }
    if (uVar8 == 0x15) {
      this->_delay_timer = this->_registers[uVar14];
    }
    else {
      if (uVar8 == 0x29) {
        uVar7 = Memory::getFontLocation(this->_m);
        uVar10 = this->_registers[uVar14] + uVar7;
        goto switchD_0010297c_caseD_a;
      }
      if (uVar8 == 0x33) {
        uVar13 = 100;
        for (iVar11 = 0; iVar11 != 3; iVar11 = iVar11 + 1) {
          Memory::putByte(this->_m,(uint)this->_index_register + iVar11,
                          (uint8_t)((long)(ulong)this->_registers[uVar14] % (long)(int)uVar13));
          uVar13 = (long)(int)uVar13 / 10 & 0xffffffff;
        }
      }
      else if (uVar8 == 0x65) {
        for (uVar13 = 0; (byte)((char)uVar14 + 1) != uVar13; uVar13 = uVar13 + 1) {
          uVar4 = Memory::getByte(this->_m,(uint)this->_index_register + (int)uVar13);
          this->_registers[uVar13] = uVar4;
        }
      }
    }
  }
  this->_program_counter = this->_program_counter + 2;
switchD_0010297c_caseD_9:
  dump(this);
  if (this->_delay_timer != '\0') {
    this->_delay_timer = this->_delay_timer + 0xff;
  }
  if (this->_sound_timer != '\0') {
    this->_sound_timer = this->_sound_timer + 0xff;
  }
  return;
}

Assistant:

void CPU::run_cycle() {
        // Decode instruction
        OpCode op = _m->getByte(_program_counter) << 8 | _m->getByte(_program_counter + 1);

        std::cout << "Operation at 0x"
            << std::hex << _program_counter << " -> " << std::setw(4) << int(op)
            << std::endl;

        Address a = op & kAddressMask;
        uint8_t rx = (op & kRegisterXMask) >> 8;
        uint8_t ry = (op & kRegisterYMask) >> 4;
        uint8_t last_byte = op & 0x0FF;

        // Run instruction
        switch (op & kOpCodeMask) {
            case 0x0000:
                if (op == 0x00E0)
                    // Clear the screen
                    _g->clear();
                else if (op == 0x00EE)
                    // Return from subroutine
                    _program_counter = _stack_pointer;
                else
                    _m->dump();
                break;

            case 0x1000:
                _program_counter = a;
                break;

            case 0x2000:
                _stack_pointer = _program_counter + 2;
                _program_counter = op & 0x0FFF;
                break;

            case 0x3000:
                if (_registers[rx] == (op & kImmediateMask))
                    _program_counter += 4;
                else
                    _program_counter += 2;
                break;

            case 0x4000:
                if (_registers[rx] != (op & kImmediateMask))
                    _program_counter += 4;
                else
                    _program_counter += 2;
                break;

            case 0x5000:
                if (_registers[rx] == _registers[ry])
                    _program_counter += 4;
                else
                    _program_counter += 2;
                break;

            case 0x6000:
                _registers[rx] = (op & kImmediateMask);
                _program_counter += 2;
                break;

            case 0x7000:
                _registers[rx] += (op & kImmediateMask);
                _program_counter += 2;
                break;

            case 0x8000:
                switch (op & kLastNibble) {
                    case 0x0:
                        // Sets VX to the value of VY
                        _registers[rx] = _registers[ry];
                        break;
                    case 0x1:
                        // Sets VX to VX OR VY
                        _registers[rx] |= _registers[ry];
                        break;
                    case 0x2:
                        // Sets VX to VX AND VY
                        _registers[rx] &= _registers[ry];
                        break;
                    case 0x3:
                        // Sets VX to VX XOR VY
                        _registers[rx] ^= _registers[ry];
                        break;
                    case 0x4: {
                        // Adds VY to VX, VF is set to carry
                        uint16_t sum = _registers[rx] + _registers[ry];
                        _registers[0xF] = (sum > 0xFF) ? 1 : 0;
                        _registers[rx] = sum % 0xFF;
                        break;
                    }
                    case 0x5:
                        // VY is subtracted from VX, VF is set to zero when there is a borrow
                        _registers[0xF] = (_registers[ry] > _registers[rx] ? 0 : 1);
                        _registers[rx] -= _registers[ry];
                        break;
                    case 0x6:
                        // Shifts VY right by one and stores the result in VX, VF set to least
                        // significant bit before shift
                        _registers[0xF] = _registers[ry] & 0x0001;
                        _registers[rx] = _registers[ry] >> 1;
                        break;
                    case 0x7:
                        // Sets VX to VY minus VX, VF is set to zero when there is a borrow
                        _registers[0xF] = (_registers[rx] > _registers[ry] ? 0 : 1);
                        _registers[rx] = _registers[ry] - _registers[rx];
                        break;
                    case 0xE:
                        // Shifts VY left by one and stores result in VX, VF set to most
                        // significant bit before shift
                        _registers[0xF] = (_registers[ry] & 0x8000) >> 8;
                        _registers[rx] = _registers[ry] << 1;
                        break;
                }
                _program_counter += 2;
                break;

            case 0xA000:
                _index_register = (op & kAddressMask);
                _program_counter += 2;
                break;

            case 0xC000:
                _registers[rx] = std::rand() & (op & kImmediateMask);
                _program_counter += 2;
                break;

            case 0xD000: {
                int x = _registers[rx];
                int y = _registers[ry];
                int n = (op & kLastNibble);

                uint16_t sprite_pointer = _index_register;
                bool xored = false;

                // Height is determined by the last nibble
                for (int i=0; i < n; i++) {

                    // Chip8 sprites are ALWAYS 8 pixels wide
                    uint8_t sprite_mask = 0x80;
                    uint8_t sprite_row = _m->getByte(sprite_pointer + i);

                    //std::cout << "[cpu] Current sprite pointer: " << (int)sprite_pointer + i << std::endl;
                    //std::cout << "[cpu] Current sprite row: " << (int)sprite_row << std::endl;

                    for (int j=0; j<8; j++) {
                        if (sprite_row & sprite_mask) {
                            bool on = _g->get(x + j, y + i);
                            if (on) xored = true;
                            _g->set(x + j, y + i, !on);
                        }
                        sprite_mask >>= 1;
                    }
                }

                _registers[0x0F] = xored;
                _program_counter += 2;
                break;
            }

            case 0xE000:
                switch (last_byte) {
                    case 0xA1: {
                        // Skip the following instruction if the key corresponding to the hex value
                        // currently stored in register VX is not pressed.
                        uint8_t key = _registers[rx];
                        SDL_Event event;
                        while (SDL_PollEvent(&event)) {
                            if (event.type == SDL_KEYDOWN) {
                                if(event.key.keysym.sym == kKeyCodeMap[key]) {
                                    std::cout << "skipping" << std::endl;
                                    _program_counter += 2;
                                }
                            }
                        }
                    }
                }
                _program_counter += 2;
                break;

            case 0xF000:
                int mod = 100;
                switch (last_byte) {
                    case 0x07:
                        // Store the current value of the delay timer in register VX
                        _registers[rx] = _delay_timer;
                        break;

                    case 0x15:
                        // Set the delay timer to the value of register VX
                        _delay_timer = _registers[rx];
                        break;

                    case 0x29:
                        // Set index register to location of font for hex digit in VX
                        _index_register = _m->getFontLocation() + _registers[rx];
                        break;

                    case 0x33:
                        // Store the binary-coded decimal equivalent of the value stored in
                        // register VX into subsequent memory addresses starting at the address
                        // currently in the index register.
                        for (int i=0; i<3; i++) {
                            _m->putByte(_index_register + i, _registers[rx] % mod);
                            mod /= 10;
                        }
                        break;

                    case 0x65:
                        // Fill registers V0 to VX inclusive with the values stored in memory
                        // starting at the address currently in the index register.
                        for (int i=0; i<=rx; i++)
                            _registers[i] = _m->getByte(_index_register + i);
                        break;
                        // TODO: set index register to index register + x + 1 after this?
                }
                _program_counter += 2;
        }

        // Lets check out what is going on inside the registers of the CPU
        dump();

        // Decrement the timers -- because the timers run at the same clock rate as the CPU
        // itself (60hz) this is totally fine.
        // TODO: skip decrement on cycle when timers are set
        if (_delay_timer > 0) {
            _delay_timer--;
        }

        if (_sound_timer > 0) {
            _sound_timer--;
        }
    }